

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>
slang::ast::Expression::bindImplicitParam
          (DataTypeSyntax *typeSyntax,ExpressionSyntax *rhs,SourceRange assignmentRange,
          ASTContext *exprContext,ASTContext *typeContext,bitmask<slang::ast::ASTFlags> extraFlags)

{
  ExpressionKind EVar1;
  Compilation *compilation;
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bitwidth_t bVar4;
  Type *pTVar5;
  Expression *pEVar6;
  Type *type;
  Type *pTVar7;
  Expression *extraout_RDX;
  Expression *extraout_RDX_00;
  _Head_base<0UL,_const_slang::ast::Expression_*,_false> _Var8;
  SourceRange assignmentRange_00;
  tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> tVar9;
  SourceRange assignmentRange_01;
  bitmask<slang::ast::ASTFlags> in_stack_00000010;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  
  compilation = ((typeContext->scope).ptr)->compilation;
  if (rhs[3].super_SyntaxNode.previewNode != (SyntaxNode *)0x0) {
    pTVar5 = Compilation::getType
                       (compilation,(DataTypeSyntax *)rhs,(ASTContext *)extraFlags.m_bits,
                        (Type *)0x0);
    assignmentRange_00.endLoc = (SourceLocation)typeContext;
    assignmentRange_00.startLoc = (SourceLocation)exprContext;
    pEVar6 = bindRValue((Expression *)pTVar5,(Type *)assignmentRange.startLoc,
                        (ExpressionSyntax *)assignmentRange.endLoc,assignmentRange_00,
                        (ASTContext *)in_stack_00000010.m_bits,in_stack_ffffffffffffffa8);
    _Var8._M_head_impl = extraout_RDX;
    goto LAB_002cf9ba;
  }
  type = (Type *)create(compilation,(ExpressionSyntax *)assignmentRange.startLoc,typeContext,
                        in_stack_00000010,(Type *)0x0);
  pTVar5 = (Type *)(type->super_Symbol).name._M_len;
  if (rhs[1].super_SyntaxNode.parent == (SyntaxNode *)0x0) {
    bVar2 = Type::isIntegral(pTVar5);
    pTVar7 = type;
    if (bVar2) {
      bVar4 = Type::getBitWidth(pTVar5);
      for (pTVar7 = type; EVar1 = (pTVar7->super_Symbol).kind, EVar1 == MinTypMax;
          pTVar7 = *(Type **)&(pTVar7->super_Symbol).indexInScope) {
      }
      if (EVar1 == IntegerLiteral) {
        bVar2 = (char)(pTVar7->super_Symbol).indexInScope == 1;
      }
      else {
        bVar2 = EVar1 == UnbasedUnsizedIntegerLiteral;
      }
      if ((bVar2) && (bVar4 < 0x21)) {
        bVar4 = 0x20;
      }
      pTVar7 = type;
      bVar3 = Type::getIntegralFlags(pTVar5);
      pTVar5 = Compilation::getType
                         (compilation,bVar4,(bitmask<slang::ast::IntegralFlags>)(bVar3.m_bits | 2));
    }
  }
  else {
    bVar4 = Type::getBitWidth(pTVar5);
    bVar2 = Type::isIntegral(pTVar5);
    pTVar5 = type;
    if (bVar2) {
      for (; EVar1 = (pTVar5->super_Symbol).kind, EVar1 == MinTypMax;
          pTVar5 = *(Type **)&(pTVar5->super_Symbol).indexInScope) {
      }
      if (EVar1 == IntegerLiteral) {
        if ((char)(pTVar5->super_Symbol).indexInScope == 1) goto LAB_002cf91d;
      }
      else if (EVar1 == UnbasedUnsizedIntegerLiteral) goto LAB_002cf91d;
    }
    else {
LAB_002cf91d:
      bVar4 = 0x20;
    }
    pTVar7 = type;
    pTVar5 = Compilation::getType
                       (compilation,bVar4,
                        (bitmask<slang::ast::IntegralFlags>)
                        ((short)rhs[1].super_SyntaxNode.kind == LogicalEquivalenceExpression | 2));
  }
  assignmentRange_01.endLoc = (SourceLocation)0x0;
  assignmentRange_01.startLoc = (SourceLocation)exprContext;
  pEVar6 = convertAssignment((Expression *)typeContext,(ASTContext *)pTVar5,type,
                             (Expression *)assignmentRange.endLoc,assignmentRange_01,
                             (Expression **)0x0,(bitmask<slang::ast::AssignFlags> *)pTVar7);
  _Var8._M_head_impl = extraout_RDX_00;
LAB_002cf9ba:
  *(Type **)&(typeSyntax->super_ExpressionSyntax).super_SyntaxNode = pTVar5;
  (typeSyntax->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pEVar6;
  tVar9.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Head_base<0UL,_const_slang::ast::Expression_*,_false>._M_head_impl = _Var8._M_head_impl;
  tVar9.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Tuple_impl<1UL,_const_slang::ast::Type_*>.
  super__Head_base<1UL,_const_slang::ast::Type_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)typeSyntax;
  return (tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>)
         tVar9.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>;
}

Assistant:

std::tuple<const Expression*, const Type*> Expression::bindImplicitParam(
    const DataTypeSyntax& typeSyntax, const ExpressionSyntax& rhs, SourceRange assignmentRange,
    const ASTContext& exprContext, const ASTContext& typeContext, bitmask<ASTFlags> extraFlags) {

    // Rules are described in [6.20.2].
    Compilation& comp = exprContext.getCompilation();
    auto& it = typeSyntax.as<ImplicitTypeSyntax>();
    if (!it.dimensions.empty()) {
        // If we have a range provided, the result is always an integral value
        // of the provided width -- getType() will do what we want here.
        auto lhsType = &comp.getType(typeSyntax, typeContext);
        return {&bindRValue(*lhsType, rhs, assignmentRange, exprContext, extraFlags), lhsType};
    }

    Expression& expr = create(comp, rhs, exprContext, extraFlags);
    const Type* lhsType = expr.type;
    if (it.signing) {
        // If signing is provided, the result is always integral but we infer the width.
        // If the type is non-integral or unsized, infer a width of 32.
        bitwidth_t bits = lhsType->getBitWidth();
        if (!lhsType->isIntegral() || expr.isUnsizedInteger())
            bits = 32;

        bitmask<IntegralFlags> flags = IntegralFlags::FourState;
        if (it.signing.kind == TokenKind::SignedKeyword)
            flags |= IntegralFlags::Signed;

        lhsType = &comp.getType(bits, flags);
    }
    else {
        // Neither range nor signing provided, so infer from the expression type.
        // If integral, infer using rules mentioned above. Otherwise just take the type.
        if (lhsType->isIntegral()) {
            bitwidth_t bits = lhsType->getBitWidth();
            if (expr.isUnsizedInteger())
                bits = std::max(bits, 32u);

            // Keep the signed flag but force four state.
            auto flags = lhsType->getIntegralFlags();
            flags |= IntegralFlags::FourState;

            lhsType = &comp.getType(bits, flags);
        }
    }

    return {&convertAssignment(exprContext, *lhsType, expr, assignmentRange), lhsType};
}